

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.h
# Opt level: O1

void pbrt::detail::
     stringPrintfRecursive<pbrt::PixelFormat_const&,pbrt::Point2<int>const&,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>const&,char_const*>
               (string *s,char *fmt,PixelFormat *v,Point2<int> *args,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *args_1,char **args_2)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Alloc_hider _Var2;
  long *plVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  char *s_00;
  PixelFormat format;
  char **args_1_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_00;
  Point2<int> *v_00;
  string str;
  string nextFmt;
  stringstream ss;
  string local_238;
  char **local_218;
  Point2<int> *local_210;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *local_208;
  string local_200;
  char *local_1e0;
  long *local_1d8;
  long local_1c8 [2];
  ostream *local_1b8;
  undefined8 local_1b0;
  ostream local_1a8;
  undefined7 uStack_1a7;
  ios_base local_138 [264];
  
  local_210 = args;
  local_208 = args_1;
  local_1e0 = fmt;
  copyToFormatString(&local_200,&local_1e0,s);
  lVar5 = std::__cxx11::string::find('\0',0x2a);
  lVar6 = std::__cxx11::string::find('\0',0x73);
  lVar7 = std::__cxx11::string::find('\0',100);
  _Var2._M_p = local_200._M_dataplus._M_p;
  if (lVar5 == -1) {
    if (lVar7 == -1) {
      local_218 = args_2;
      if (lVar6 == -1) {
        if (local_200._M_string_length == 0) {
          s_00 = "Excess values passed to Printf.";
          iVar4 = 0x10d;
          goto LAB_00239ec2;
        }
        iVar4 = snprintf((char *)0x0,0,local_200._M_dataplus._M_p,(ulong)*v);
        local_1b0 = 0;
        local_1a8 = (ostream)0x0;
        local_1b8 = &local_1a8;
        std::__cxx11::string::resize((ulong)&local_1b8,(char)(iVar4 + 1));
        snprintf((char *)local_1b8,(long)(iVar4 + 1),_Var2._M_p,(ulong)*v);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)local_1b8);
        args_00 = local_208;
        args_1_00 = local_218;
        v_00 = local_210;
        if (local_1b8 != &local_1a8) {
          operator_delete(local_1b8,CONCAT71(uStack_1a7,local_1a8) + 1);
          args_1_00 = local_218;
          v_00 = local_210;
        }
      }
      else {
        std::__cxx11::stringstream::stringstream((stringstream *)&local_1b8);
        pbrt::ToString_abi_cxx11_(&local_238,(pbrt *)(ulong)*v,format);
        std::__ostream_insert<char,std::char_traits<char>>
                  (&local_1a8,local_238._M_dataplus._M_p,local_238._M_string_length);
        paVar1 = &local_238.field_2;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        _Var2._M_p = local_200._M_dataplus._M_p;
        std::__cxx11::stringbuf::str();
        plVar3 = local_1d8;
        iVar4 = snprintf((char *)0x0,0,_Var2._M_p,local_1d8);
        local_238._M_string_length = 0;
        local_238.field_2._M_local_buf[0] = '\0';
        local_238._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::resize((ulong)&local_238,(char)(iVar4 + 1));
        snprintf(local_238._M_dataplus._M_p,(long)(iVar4 + 1),_Var2._M_p,plVar3);
        std::__cxx11::string::pop_back();
        std::__cxx11::string::_M_append((char *)s,(ulong)local_238._M_dataplus._M_p);
        args_00 = local_208;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_238._M_dataplus._M_p != paVar1) {
          operator_delete(local_238._M_dataplus._M_p,
                          CONCAT71(local_238.field_2._M_allocated_capacity._1_7_,
                                   local_238.field_2._M_local_buf[0]) + 1);
        }
        v_00 = local_210;
        args_1_00 = local_218;
        if (local_1d8 != local_1c8) {
          operator_delete(local_1d8,local_1c8[0] + 1);
        }
        std::__cxx11::stringstream::~stringstream((stringstream *)&local_1b8);
        std::ios_base::~ios_base(local_138);
      }
      stringPrintfRecursive<pbrt::Point2<int>const&,pstd::vector<std::__cxx11::string,pstd::pmr::polymorphic_allocator<std::__cxx11::string>>const&,char_const*>
                (s,local_1e0,v_00,args_00,args_1_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_200._M_dataplus._M_p != &local_200.field_2) {
        operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
      }
      return;
    }
    s_00 = "Non-integral type passed to %d format.";
    iVar4 = 0x104;
  }
  else {
    s_00 = "Non-integral type provided for %* format.";
    iVar4 = 0xe8;
  }
LAB_00239ec2:
  LogFatal(Fatal,
           "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/print.h"
           ,iVar4,s_00);
}

Assistant:

inline void stringPrintfRecursive(std::string *s, const char *fmt, T &&v,
                                  Args &&... args) {
    std::string nextFmt = copyToFormatString(&fmt, s);
    bool precisionViaArg = nextFmt.find('*') != std::string::npos;

    bool isSFmt = nextFmt.find('s') != std::string::npos;
    bool isDFmt = nextFmt.find('d') != std::string::npos;

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (precisionViaArg) {
            stringPrintfRecursiveWithPrecision(s, fmt, nextFmt, v,
                                               std::forward<Args>(args)...);
            return;
        }
    } else if (precisionViaArg)
        LOG_FATAL("Non-integral type provided for %* format.");

    if constexpr (std::is_same<std::decay_t<T>, float>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::FloatToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, double>::value)
        if (nextFmt == "%f" || nextFmt == "%s") {
            *s += detail::DoubleToString(v);
            goto done;
        }

    if constexpr (std::is_same<std::decay_t<T>, bool>::value)  // FIXME: %-10s with bool
        if (isSFmt) {
            *s += bool(v) ? "true" : "false";
            goto done;
        }

    if constexpr (std::is_integral<std::decay_t<T>>::value) {
        if (isDFmt) {
            nextFmt.replace(nextFmt.find('d'), 1,
                            detail::IntegerFormatTrait<std::decay_t<T>>::fmt());
            *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
            goto done;
        }
    } else if (isDFmt)
        LOG_FATAL("Non-integral type passed to %d format.");

    if (isSFmt) {
        std::stringstream ss;
        ss << v;
        *s += formatOne(nextFmt.c_str(), ss.str().c_str());
    } else if (!nextFmt.empty())
        *s += formatOne(nextFmt.c_str(), std::forward<T>(v));
    else
        LOG_FATAL("Excess values passed to Printf.");

done:
    stringPrintfRecursive(s, fmt, std::forward<Args>(args)...);
}